

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_oarchive.h
# Opt level: O2

void __thiscall serialization::xml_oarchive::save_sequence_item_start(xml_oarchive *this)

{
  xml_node<char> *child;
  
  child = rapidxml::memory_pool<char>::allocate_node
                    (&(this->document_).super_memory_pool<char>,node_element,"item",(char *)0x0,0,0)
  ;
  rapidxml::xml_node<char>::append_node(this->current_,child);
  this->current_ = child;
  return;
}

Assistant:

void save_sequence_item_start()
    {
        serialization_trace trace(__func__, "xml");
        auto node = document_.allocate_node(rapidxml::node_element, "item");
        current_->append_node(node);
        current_ = node;
    }